

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O1

bool __thiscall
ExternalTester::testAnisotropicRefinement
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TypeDepth type,
          int min_growth,int *np,double *errs,int max_iter)

{
  byte bVar1;
  long *plVar2;
  ostream *poVar3;
  int *piVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  TestResults TVar8;
  vector<double,_std::allocator<double>_> local_58;
  ulong local_38;
  
  bVar6 = max_iter < 1;
  if (0 < max_iter) {
    local_38 = (ulong)(uint)max_iter;
    uVar5 = 0;
    do {
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      TVar8 = getError(this,f,grid,type_internal_interpolation,&local_58);
      dVar7 = TVar8.error;
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((TVar8.num_points != np[uVar5]) || (errs[uVar5] <= dVar7 && dVar7 != errs[uVar5])) {
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x12;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: FAILED refinement test at iteration: ",0x2c);
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," expected: ",0xb);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,np[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(errs[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"   computed: ",0xd);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,TVar8.num_points);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
        poVar3 = std::ostream::_M_insert<double>(dVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        return bVar6;
      }
      if (*(long **)(grid + 8) == (long *)0x0) {
        piVar4 = (int *)0xffffffff;
      }
      else {
        bVar1 = (**(code **)(**(long **)(grid + 8) + 0x10))();
        piVar4 = (int *)(ulong)(bVar1 - 1);
      }
      TasGrid::TasmanianSparseGrid::setAnisotropicRefinement((TypeDepth)grid,type,min_growth,piVar4)
      ;
      uVar5 = uVar5 + 1;
      bVar6 = local_38 <= uVar5;
    } while (uVar5 != local_38);
  }
  return bVar6;
}

Assistant:

bool ExternalTester::testAnisotropicRefinement(const BaseFunction *f, TasmanianSparseGrid &grid, TypeDepth type, int min_growth, const int np[], const double errs[], int max_iter ) const{
    for(int itr=0; itr<max_iter; itr++){
        TestResults R = getError(f, grid, type_internal_interpolation);
        if ( (R.num_points != np[itr]) || (R.error > errs[itr]) ){
            cout << setw(18) << "ERROR: FAILED refinement test at iteration: " << itr << endl;
            cout << " expected: " << np[itr] << "  " << errs[itr] << "   computed: " << R.num_points << "  " << R.error << endl;
            return false;
        }
        grid.setAnisotropicRefinement(type, min_growth, (grid.isGlobal()) ? 0 : -1);
    }
    return true;
}